

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mutex.cpp
# Opt level: O1

void __thiscall Mutex::Mutex(Mutex *this)

{
  code *pcVar1;
  int iVar2;
  pthread_mutexattr_t attr;
  pthread_mutexattr_t local_14;
  
  pthread_mutexattr_init(&local_14);
  pthread_mutexattr_settype(&local_14,1);
  iVar2 = pthread_mutex_init((pthread_mutex_t *)this,&local_14);
  if (iVar2 != 0) {
    iVar2 = Debug::printf("%s:%u: verification failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]dehprox/3rdparty/libnstd/src/Mutex.cpp"
                          ,0x16,"pthread_mutex_init((pthread_mutex_t*)data, &attr) == 0");
    if (iVar2 != 0) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  return;
}

Assistant:

Mutex::Mutex()
{
#ifdef _WIN32
  ASSERT(sizeof(data) >= sizeof(CRITICAL_SECTION));
  InitializeCriticalSection(&(CRITICAL_SECTION&)data);
#else
  ASSERT(sizeof(data) >= sizeof(pthread_mutex_t));
  pthread_mutexattr_t attr; // TODO: use global var for this?
  pthread_mutexattr_init(&attr);
  pthread_mutexattr_settype(&attr, PTHREAD_MUTEX_RECURSIVE);
  VERIFY(pthread_mutex_init((pthread_mutex_t*)data, &attr) == 0);
#endif
}